

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::BinaryReaderObjdump
          (BinaryReaderObjdump *this,uint8_t *data,size_t size,ObjdumpOptions *options,
          ObjdumpState *objdump_state)

{
  ObjdumpState *objdump_state_local;
  ObjdumpOptions *options_local;
  size_t size_local;
  uint8_t *data_local;
  BinaryReaderObjdump *this_local;
  
  BinaryReaderObjdumpBase::BinaryReaderObjdumpBase
            (&this->super_BinaryReaderObjdumpBase,data,size,options,objdump_state);
  (this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
  _vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdump_001b90b8;
  FileStream::CreateStdout();
  this->elem_index_ = 0;
  this->table_index_ = 0;
  this->next_data_reloc_ = 0;
  this->in_data_section_ = false;
  this->in_elem_section_ = false;
  this->data_flags_ = '\0';
  this->elem_flags_ = '\0';
  this->data_mem_index_ = 0;
  this->data_offset_ = 0;
  this->elem_offset_ = 0;
  return;
}

Assistant:

BinaryReaderObjdump::BinaryReaderObjdump(const uint8_t* data,
                                         size_t size,
                                         ObjdumpOptions* options,
                                         ObjdumpState* objdump_state)
    : BinaryReaderObjdumpBase(data, size, options, objdump_state),
      out_stream_(FileStream::CreateStdout()) {}